

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

bool __thiscall Analyzer::findFunctionReturnTypes(Analyzer *this,Node *node,uint *return_flags)

{
  uint uVar1;
  TokenType TVar2;
  pointer ppNVar3;
  bool bVar4;
  NodeType NVar5;
  Node *pNVar6;
  size_t i_1;
  ulong uVar7;
  bool bVar8;
  size_t i;
  
  bVar8 = false;
  switch(node->nodeType) {
  case PNT_STATEMENT_LIST:
    bVar8 = false;
    for (uVar7 = 0;
        ppNVar3 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3);
        uVar7 = uVar7 + 1) {
      pNVar6 = ppNVar3[uVar7];
      if (pNVar6 != (Node *)0x0) {
        bVar4 = findFunctionReturnTypes(this,pNVar6,return_flags);
        bVar8 = (bool)(bVar8 | bVar4);
      }
    }
    break;
  case PNT_IF_ELSE:
    bVar8 = findFunctionReturnTypes
                      (this,(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[1],return_flags);
    ppNVar3 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppNVar3) < 0x11) {
      bVar4 = false;
    }
    else {
      bVar4 = findFunctionReturnTypes(this,ppNVar3[2],return_flags);
    }
    bVar8 = (bool)(bVar8 & bVar4);
    break;
  case PNT_WHILE_LOOP:
  case PNT_DO_WHILE_LOOP:
  case PNT_FOR_LOOP:
  case PNT_FOR_EACH_LOOP:
    for (uVar7 = 0;
        ppNVar3 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3);
        uVar7 = uVar7 + 1) {
      pNVar6 = ppNVar3[uVar7];
      if (pNVar6 != (Node *)0x0) {
        findFunctionReturnTypes(this,pNVar6,return_flags);
      }
    }
    bVar8 = false;
    break;
  case PNT_RETURN:
    ppNVar3 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish == ppNVar3) {
      *(byte *)return_flags = (byte)*return_flags | 1;
    }
    else {
      pNVar6 = *ppNVar3;
      NVar5 = pNVar6->nodeType;
      if (NVar5 == PNT_EXPRESSION_PAREN) {
        pNVar6 = *(pNVar6->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        NVar5 = pNVar6->nodeType;
      }
      switch(NVar5) {
      case PNT_NULL:
        *(byte *)return_flags = (byte)*return_flags | 2;
        break;
      case PNT_STRING:
        *(byte *)return_flags = (byte)*return_flags | 0x10;
        break;
      case PNT_IDENTIFIER:
      case PNT_VAR_PARAMS:
      case PNT_KEY_VALUE:
      case PNT_MAKE_KEY:
      case PNT_LIST_OF_KEYS_ARRAY:
      case PNT_LIST_OF_KEYS_TABLE:
      case PNT_READER_MACRO:
      case PNT_UNARY_POST_OP:
switchD_0011f923_caseD_6:
        *(byte *)((long)return_flags + 1) = *(byte *)((long)return_flags + 1) | 2;
        break;
      case PNT_UNARY_PRE_OP:
        TVar2 = pNVar6->tok->type;
        if ((TVar2 != TK_MINUS) && (TVar2 != TK_INV)) {
          if (TVar2 != TK_NOT) goto switchD_0011f923_caseD_6;
          goto switchD_0011f923_caseD_3;
        }
      case PNT_INTEGER:
      case PNT_FLOAT:
switchD_0011f923_caseD_2:
        *(byte *)return_flags = (byte)*return_flags | 8;
        break;
      case PNT_BINARY_OP:
        TVar2 = pNVar6->tok->type;
        uVar1 = TVar2 - TK_MINUS;
        if (uVar1 < 0x3b) {
          if ((0x400000003fc0000U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto switchD_0011f923_caseD_3;
          if ((0xe7UL >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto switchD_0011f923_caseD_2;
        }
        if (TVar2 != TK_NOTIN) goto switchD_0011f923_caseD_6;
      case PNT_BOOL:
switchD_0011f923_caseD_3:
        *(byte *)return_flags = (byte)*return_flags | 4;
        break;
      default:
        if (NVar5 == PNT_FUNCTION_CALL) {
          *(byte *)((long)return_flags + 1) = *(byte *)((long)return_flags + 1) | 1;
        }
        else if (NVar5 == PNT_ARRAY_CREATION) {
          *(byte *)return_flags = (byte)*return_flags | 0x40;
        }
        else if (NVar5 == PNT_TABLE_CREATION) {
          *(byte *)return_flags = (byte)*return_flags | 0x20;
        }
        else {
          if (NVar5 != PNT_LAMBDA) goto switchD_0011f923_caseD_6;
          *(byte *)return_flags = (byte)*return_flags | 0x80;
        }
      }
    }
    bVar8 = true;
    break;
  case PNT_SWITCH_STATEMENT:
    bVar8 = true;
    for (uVar7 = 1;
        ppNVar3 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3);
        uVar7 = uVar7 + 1) {
      pNVar6 = ppNVar3[uVar7];
      if ((pNVar6 != (Node *)0x0) &&
         ((pNVar6->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start[1] != (Node *)0x0)) {
        bVar4 = findFunctionReturnTypes(this,pNVar6,return_flags);
        bVar8 = (bool)(bVar8 & bVar4);
      }
    }
  }
  return bVar8;
}

Assistant:

bool findFunctionReturnTypes(Node * node, unsigned & return_flags)  // returns 'all ways return value'
  {
    if (node->nodeType == PNT_RETURN)
    {
      if (node->children.size() == 0)
      {
        return_flags |= RT_NOTHING;
        return true;
      }

      Node * val = node->children[0];
      if (val->nodeType == PNT_EXPRESSION_PAREN)
        val = val->children[0];

      if (val->nodeType == PNT_NULL)
        return_flags |= RT_NULL;
      else if (val->nodeType == PNT_BOOL)
        return_flags |= RT_BOOL;
      else if (val->nodeType == PNT_INTEGER || val->nodeType == PNT_FLOAT)
        return_flags |= RT_NUMBER;
      else if (val->nodeType == PNT_BINARY_OP && (
        val->tok.type == TK_EQ || val->tok.type == TK_NE || val->tok.type == TK_GT || val->tok.type == TK_GE ||
        val->tok.type == TK_LS || val->tok.type == TK_LE || val->tok.type == TK_IN || val->tok.type == TK_NOTIN ||
        val->tok.type == TK_AND ||
        val->tok.type == TK_OR))
      {
        return_flags |= RT_BOOL;
      }
      else if (val->nodeType == PNT_BINARY_OP && (val->tok.type == TK_MINUS || val->tok.type == TK_DIV ||
        val->tok.type == TK_MUL || val->tok.type == TK_BITAND || val->tok.type == TK_BITOR || val->tok.type == TK_BITXOR))
      {
        return_flags |= RT_NUMBER;
      }
      else if (val->nodeType == PNT_UNARY_PRE_OP && (val->tok.type == TK_NOT))
        return_flags |= RT_BOOL;
      else if (val->nodeType == PNT_UNARY_PRE_OP && (val->tok.type == TK_MINUS || val->tok.type == TK_INV))
        return_flags |= RT_NUMBER;
      else if (val->nodeType == PNT_STRING)
        return_flags |= RT_STRING;
      else if (val->nodeType == PNT_ARRAY_CREATION)
        return_flags |= RT_ARRAY;
      else if (val->nodeType == PNT_TABLE_CREATION)
        return_flags |= RT_TABLE;
      else if (val->nodeType == PNT_LAMBDA)
        return_flags |= RT_CLOSURE;
      else if (val->nodeType == PNT_FUNCTION_CALL)
        return_flags |= RT_FUNCTION_CALL;
      else
        return_flags |= RT_UNRECOGNIZED;

      return true;
    }
    else if (node->nodeType == PNT_IF_ELSE)
    {
      bool retThen = findFunctionReturnTypes(node->children[1], return_flags);
      bool retElse = false;
      if (node->children.size() > 2)
        retElse = findFunctionReturnTypes(node->children[2], return_flags);
      return retThen && retElse;
    }
    else if (node->nodeType == PNT_WHILE_LOOP || node->nodeType == PNT_DO_WHILE_LOOP || node->nodeType == PNT_FOR_EACH_LOOP ||
      node->nodeType == PNT_FOR_LOOP)
    {
      for (size_t i = 0; i < node->children.size(); i++)
        if (node->children[i])
          (void)findFunctionReturnTypes(node->children[i], return_flags);
      return false;
    }
    else if (node->nodeType == PNT_STATEMENT_LIST)
    {
      bool retFound = false;
      for (size_t i = 0; i < node->children.size(); i++)
        if (node->children[i])
          retFound |= findFunctionReturnTypes(node->children[i], return_flags);
      return retFound;
    }
    else if (node->nodeType == PNT_SWITCH_STATEMENT)
    {
      bool allReturn = true;
      for (size_t i = 1; i < node->children.size(); i++)
        if (node->children[i] && node->children[i]->children[1])
          allReturn &= findFunctionReturnTypes(node->children[i], return_flags);
      return allReturn;
    }

    return false;
  }